

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::TemplateNode> __thiscall
minja::Parser::parse(Parser *this,string *template_str,Options *options)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<minja::TemplateNode> sVar1;
  TemplateTokenIterator begin;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  TemplateTokenVector tokens;
  TemplateTokenIterator end;
  TemplateTokenIterator it;
  Parser parser;
  
  std::__cxx11::string::string((string *)&tokens,(string *)template_str);
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&begin);
  Parser(&parser,(shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&begin,options);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__cxx11::string::~string((string *)&tokens);
  tokenize(&tokens,&parser);
  begin._M_current =
       tokens.
       super__Vector_base<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  it._M_current =
       tokens.
       super__Vector_base<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  end._M_current =
       tokens.
       super__Vector_base<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  parseTemplate(this,(TemplateTokenIterator *)&parser,&begin,&it,SUB81(&end,0));
  std::
  vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>
  ::~vector(&tokens);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.template_str.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar1.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::TemplateNode>)
         sVar1.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<TemplateNode> parse(const std::string& template_str, const Options & options) {
        Parser parser(std::make_shared<std::string>(normalize_newlines(template_str)), options);
        auto tokens = parser.tokenize();
        TemplateTokenIterator begin = tokens.begin();
        auto it = begin;
        TemplateTokenIterator end = tokens.end();
        return parser.parseTemplate(begin, it, end, /* fully= */ true);
    }